

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
          (ShaderImageLoadStoreBase *this,vec4 *v0,vec4 *v1,GLenum internalformat)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  float fVar4;
  
  uVar1 = (int)v1 - 0x8f94;
  if (7 < uVar1) {
LAB_0098bde7:
    fVar4 = *(float *)&(this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper;
    if ((fVar4 == v0->m_data[0]) && (!NAN(fVar4) && !NAN(v0->m_data[0]))) {
      fVar4 = *(float *)((long)&(this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper + 4);
      if ((fVar4 == v0->m_data[1]) && (!NAN(fVar4) && !NAN(v0->m_data[1]))) {
        fVar4 = *(float *)&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.m_gl;
        if ((fVar4 == v0->m_data[2]) && (!NAN(fVar4) && !NAN(v0->m_data[2]))) {
          return (bool)(-(v0->m_data[3] ==
                         *(float *)((long)&(this->super_SubcaseBase).super_GLWrapper.
                                           super_CallLogWrapper.m_gl + 4)) & 1);
        }
      }
    }
    return false;
  }
  if ((0xbU >> (uVar1 & 0x1f) & 1) == 0) {
    if ((0xb0U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_0098bde7;
    if (0.0001 < ABS(*(float *)&(this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper -
                     v0->m_data[0])) {
      return false;
    }
    if (0.0001 < ABS(*(float *)((long)&(this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper + 4
                               ) - v0->m_data[1])) {
      return false;
    }
    if (0.0001 < ABS(*(float *)&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.m_gl
                     - v0->m_data[2])) {
      return false;
    }
    fVar4 = ABS(*(float *)((long)&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.
                                  m_gl + 4) - v0->m_data[3]);
    bVar3 = fVar4 == 0.0001;
    bVar2 = fVar4 < 0.0001;
  }
  else {
    if (0.01 < ABS(*(float *)&(this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper -
                   v0->m_data[0])) {
      return false;
    }
    if (0.01 < ABS(*(float *)((long)&(this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper + 4)
                   - v0->m_data[1])) {
      return false;
    }
    if (0.01 < ABS(*(float *)&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.m_gl -
                   v0->m_data[2])) {
      return false;
    }
    fVar4 = ABS(*(float *)((long)&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.
                                  m_gl + 4) - v0->m_data[3]);
    bVar3 = fVar4 == 0.01;
    bVar2 = fVar4 < 0.01;
  }
  return bVar2 || bVar3;
}

Assistant:

bool Equal(const vec4& v0, const vec4& v1, GLenum internalformat)
	{
		if (internalformat == GL_RGBA16_SNORM || internalformat == GL_RG16_SNORM || internalformat == GL_R16_SNORM)
		{
			return ColorEqual(v0, v1, vec4(0.0001f));
		}
		else if (internalformat == GL_RGBA8_SNORM || internalformat == GL_RG8_SNORM || internalformat == GL_R8_SNORM)
		{
			return ColorEqual(v0, v1, vec4(0.01f));
		}
		return (v0[0] == v1[0]) && (v0[1] == v1[1]) && (v0[2] == v1[2]) && (v0[3] == v1[3]);
	}